

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O1

uint32_t * unpack20_8(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint uVar1;
  
  *out = (*in & 0xfffff) + base;
  uVar1 = *in;
  out[1] = uVar1 >> 0x14;
  out[1] = (uVar1 >> 0x14) + base + (in[1] & 0xff) * 0x1000;
  out[2] = (in[1] >> 8 & 0xfffff) + base;
  uVar1 = in[1];
  out[3] = uVar1 >> 0x1c;
  out[3] = (uVar1 >> 0x1c) + base + (in[2] & 0xffff) * 0x10;
  uVar1 = in[2];
  out[4] = uVar1 >> 0x10;
  out[4] = (uVar1 >> 0x10) + base + (in[3] & 0xf) * 0x10000;
  out[5] = (in[3] >> 4 & 0xfffff) + base;
  uVar1 = in[3];
  out[6] = uVar1 >> 0x18;
  out[6] = (uVar1 >> 0x18) + base + (in[4] & 0xfff) * 0x100;
  out[7] = (in[4] >> 0xc) + base;
  return in + 5;
}

Assistant:

uint32_t * unpack20_8( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out = ( (*in) >>  0  )   % (1U << 20 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  20  ) ;
    ++in;
    *out |= ((*in) % (1U<< 8 ))<<( 20 - 8 );
    *out += base;
    out++;
    *out = ( (*in) >>  8  )   % (1U << 20 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  28  ) ;
    ++in;
    *out |= ((*in) % (1U<< 16 ))<<( 20 - 16 );
    *out += base;
    out++;
    *out = ( (*in) >>  16  ) ;
    ++in;
    *out |= ((*in) % (1U<< 4 ))<<( 20 - 4 );
    *out += base;
    out++;
    *out = ( (*in) >>  4  )   % (1U << 20 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  24  ) ;
    ++in;
    *out |= ((*in) % (1U<< 12 ))<<( 20 - 12 );
    *out += base;
    out++;
    *out = ( (*in) >>  12  ) ;
    ++in;
    *out += base;
    out++;

    return in;
}